

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
* toml::detail::parse_escape_sequence<toml::type_config>
            (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  long lVar4;
  size_t sVar5;
  value_type *pvVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  error_info *v_00;
  error_info *v_01;
  error_info *v_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  char cVar10;
  ulong uVar11;
  EVP_PKEY_CTX *ctx_00;
  _Alloc_hider _Var12;
  size_t sVar13;
  EVP_PKEY_CTX *this;
  string_type retval;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  utf8;
  sequence scanner;
  region reg;
  string escape_seqs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  undefined1 local_720 [8];
  undefined1 auStack_718 [72];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d0;
  pointer local_6c0;
  pointer pbStack_6b8;
  pointer local_6b0;
  sequence local_6a8;
  undefined1 local_688 [104];
  undefined1 local_620 [104];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  source_location local_498;
  source_location local_418;
  source_location local_398;
  source_location local_318;
  failure<toml::error_info> local_298;
  failure<toml::error_info> local_240;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar5 = loc->location_;
  lVar4 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar11 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - lVar4;
  if (sVar5 + 1 < uVar11) {
    if (*(char *)(lVar4 + sVar5) == '\n') {
      loc->line_number_ = loc->line_number_ + 1;
      sVar7 = 1;
    }
    else {
      sVar7 = loc->column_number_ + 1;
    }
    loc->column_number_ = sVar7;
    uVar11 = sVar5 + 1;
  }
  else if (uVar11 != sVar5) {
    sVar7 = loc->line_number_;
    sVar13 = loc->column_number_;
    do {
      if (*(char *)(lVar4 + sVar5) == '\n') {
        sVar7 = sVar7 + 1;
        loc->line_number_ = sVar7;
        sVar13 = 1;
      }
      else {
        sVar13 = sVar13 + 1;
      }
      loc->column_number_ = sVar13;
      sVar5 = sVar5 + 1;
    } while (uVar11 != sVar5);
  }
  loc->location_ = uVar11;
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  local_740._M_string_length = 0;
  local_740.field_2._M_local_buf[0] = '\0';
  lVar4 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar9 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar4;
  if (uVar11 < uVar9) {
    if (*(char *)(lVar4 + uVar11) != '\\') {
      if (uVar9 <= uVar11) goto LAB_003d29ca;
      if (*(char *)(lVar4 + uVar11) == '\"') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_740,'\"');
        peVar3 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar9 = loc->location_;
        uVar11 = uVar9 + 1;
        v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
        uVar8 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)v;
        if (uVar11 < uVar8) goto LAB_003d2768;
        if (uVar8 != uVar9) {
          sVar5 = loc->line_number_;
          sVar7 = loc->column_number_;
          do {
            if (*(char *)((long)&(v->_M_dataplus)._M_p + uVar9) == '\n') {
              sVar5 = sVar5 + 1;
              loc->line_number_ = sVar5;
              sVar7 = 1;
            }
            else {
              sVar7 = sVar7 + 1;
            }
            loc->column_number_ = sVar7;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        goto LAB_003d282e;
      }
      if (uVar9 <= uVar11) goto LAB_003d29ca;
      if (*(char *)(lVar4 + uVar11) == 'b') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_740,'\b');
        peVar3 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar9 = loc->location_;
        uVar11 = uVar9 + 1;
        v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
        uVar8 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)v;
        if (uVar11 < uVar8) goto LAB_003d2768;
        if (uVar8 != uVar9) {
          sVar5 = loc->line_number_;
          sVar7 = loc->column_number_;
          do {
            if (*(char *)((long)&(v->_M_dataplus)._M_p + uVar9) == '\n') {
              sVar5 = sVar5 + 1;
              loc->line_number_ = sVar5;
              sVar7 = 1;
            }
            else {
              sVar7 = sVar7 + 1;
            }
            loc->column_number_ = sVar7;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        goto LAB_003d282e;
      }
      if (uVar9 <= uVar11) goto LAB_003d29ca;
      if (*(char *)(lVar4 + uVar11) == 'f') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_740,'\f');
        peVar3 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar9 = loc->location_;
        uVar11 = uVar9 + 1;
        v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
        uVar8 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)v;
        if (uVar11 < uVar8) goto LAB_003d2768;
        if (uVar8 != uVar9) {
          sVar5 = loc->line_number_;
          sVar7 = loc->column_number_;
          do {
            if (*(char *)((long)&(v->_M_dataplus)._M_p + uVar9) == '\n') {
              sVar5 = sVar5 + 1;
              loc->line_number_ = sVar5;
              sVar7 = 1;
            }
            else {
              sVar7 = sVar7 + 1;
            }
            loc->column_number_ = sVar7;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        goto LAB_003d282e;
      }
      if (uVar9 <= uVar11) goto LAB_003d29ca;
      if (*(char *)(lVar4 + uVar11) == 'n') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_740,'\n');
        peVar3 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar9 = loc->location_;
        uVar11 = uVar9 + 1;
        v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
        uVar8 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)v;
        if (uVar11 < uVar8) goto LAB_003d2768;
        if (uVar8 != uVar9) {
          sVar5 = loc->line_number_;
          sVar7 = loc->column_number_;
          do {
            if (*(char *)((long)&(v->_M_dataplus)._M_p + uVar9) == '\n') {
              sVar5 = sVar5 + 1;
              loc->line_number_ = sVar5;
              sVar7 = 1;
            }
            else {
              sVar7 = sVar7 + 1;
            }
            loc->column_number_ = sVar7;
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        goto LAB_003d282e;
      }
      if (uVar9 <= uVar11) goto LAB_003d29ca;
      if (*(char *)(lVar4 + uVar11) == 'r') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_740,'\r');
      }
      else {
        if ((uVar9 <= uVar11) || (*(char *)(lVar4 + uVar11) != 't')) goto LAB_003d29ca;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_740,'\t');
      }
      goto LAB_003d29eb;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_740,'\\');
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar9 = loc->location_;
    uVar11 = uVar9 + 1;
    v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
    uVar8 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)v;
    if (uVar11 < uVar8) {
LAB_003d2768:
      if (*(char *)((long)&(v->_M_dataplus)._M_p + uVar9) == '\n') {
        loc->line_number_ = loc->line_number_ + 1;
        sVar5 = 1;
      }
      else {
        sVar5 = loc->column_number_ + 1;
      }
      loc->column_number_ = sVar5;
      uVar8 = uVar11;
    }
    else if (uVar8 != uVar9) {
      sVar5 = loc->line_number_;
      sVar7 = loc->column_number_;
      do {
        if (*(char *)((long)&(v->_M_dataplus)._M_p + uVar9) == '\n') {
          sVar5 = sVar5 + 1;
          loc->line_number_ = sVar5;
          sVar7 = 1;
        }
        else {
          sVar7 = sVar7 + 1;
        }
        loc->column_number_ = sVar7;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
LAB_003d282e:
    loc->location_ = uVar8;
  }
  else {
LAB_003d29ca:
    if ((uVar9 <= uVar11) ||
       (((ctx->toml_spec_).v1_1_0_add_escape_sequence_e == false ||
        (*(char *)(lVar4 + uVar11) != 'e')))) {
      if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_x == true) {
        if (uVar11 < uVar9) {
          if (*(char *)(lVar4 + uVar11) != 'x') goto LAB_003d2b20;
          local_620._0_8_ = &PTR__scanner_base_005687c8;
          local_620[8] = 'x';
          syntax::hexdig::hexdig((hexdig *)local_720,&ctx->toml_spec_);
          local_688._0_8_ = &PTR__repeat_exact_005689e8;
          local_688._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
          scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
                    ((scanner_storage *)(local_688 + 0x10),(hexdig *)local_720);
          sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                    (&local_6a8,(character *)local_620,(repeat_exact *)local_688);
          if ((tuple<toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
              )local_688._16_8_ != (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
            (*(*(_func_int ***)local_688._16_8_)[1])();
          }
          local_688._16_8_ =
               (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                )0x0;
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(auStack_718 + 8));
          sequence::scan((region *)local_688,&local_6a8,loc);
          if ((_func_int **)local_688._0_8_ == (_func_int **)0x0) {
            region::region((region *)local_620,loc);
            source_location::source_location((source_location *)local_720,(region *)local_620);
            region::~region((region *)local_620);
            local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4b8,
                       "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\xhh",
                       "");
            local_318.file_name_._M_dataplus._M_p = (pointer)&local_318.file_name_.field_2;
            local_318.last_offset_._0_4_ = auStack_718._40_4_;
            local_318.last_offset_._4_4_ = auStack_718._44_4_;
            local_318.length_._0_4_ = auStack_718._48_4_;
            local_318.length_._4_4_ = auStack_718._52_4_;
            local_318.last_line_._0_4_ = auStack_718._24_4_;
            local_318.last_line_._4_4_ = auStack_718._28_4_;
            local_318.last_column_._0_4_ = auStack_718._32_4_;
            local_318.last_column_._4_4_ = auStack_718._36_4_;
            local_318.first_column_._0_4_ = auStack_718._8_4_;
            local_318.first_column_._4_4_ = auStack_718._12_4_;
            local_318.first_offset_._0_4_ = auStack_718._16_4_;
            local_318.first_offset_._4_4_ = auStack_718._20_4_;
            local_318.first_line_ = auStack_718._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)auStack_718._56_8_ == &local_6d0) {
              local_318.file_name_.field_2._8_8_ = local_6d0._8_8_;
            }
            else {
              local_318.file_name_._M_dataplus._M_p = (pointer)auStack_718._56_8_;
            }
            local_318.file_name_._M_string_length = auStack_718._64_8_;
            auStack_718._64_8_ = 0;
            local_6d0._M_local_buf[0] = '\0';
            local_318.line_str_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = local_6c0;
            local_318.line_str_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbStack_6b8;
            local_318.line_str_.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6b0;
            local_6c0 = (pointer)0x0;
            pbStack_6b8 = (pointer)0x0;
            local_6b0 = (pointer)0x0;
            auStack_718._56_8_ = &local_6d0;
            local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"here","");
            make_error_info<>((error_info *)local_620,&local_4b8,&local_318,&local_4d8);
            err<toml::error_info>(&local_88,(error_info *)local_620);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_88);
            failure<toml::error_info>::~failure(&local_88);
            error_info::~error_info((error_info *)local_620);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
              operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location(&local_318);
            local_538.field_2._M_allocated_capacity = local_4b8.field_2._M_allocated_capacity;
            _Var12._M_p = local_4b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) goto LAB_003d3685;
            goto LAB_003d368d;
          }
          parse_utf8_codepoint<toml::type_config>
                    ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                      *)local_720,(region *)local_688);
          if ((bool)local_720[0] == false) {
            err<toml::error_info_const&>(&local_1e8,(toml *)auStack_718,v_00);
            __return_storage_ptr__->is_ok_ = false;
            this = (EVP_PKEY_CTX *)&local_1e8;
            goto LAB_003d3491;
          }
          pvVar6 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                   ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                             *)local_720,(source_location)0x568f10);
          ctx_00 = (EVP_PKEY_CTX *)(pvVar6->_M_dataplus)._M_p;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_740,(char *)ctx_00,pvVar6->_M_string_length);
          cVar10 = local_720[0];
          goto LAB_003d34a1;
        }
      }
      else {
LAB_003d2b20:
        if (uVar11 < uVar9) {
          if (*(char *)(lVar4 + uVar11) == 'u') {
            local_620._0_8_ = &PTR__scanner_base_005687c8;
            local_620[8] = 'u';
            syntax::hexdig::hexdig((hexdig *)local_720,&ctx->toml_spec_);
            local_688._0_8_ = &PTR__repeat_exact_005689e8;
            local_688._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
            scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
                      ((scanner_storage *)(local_688 + 0x10),(hexdig *)local_720);
            sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                      (&local_6a8,(character *)local_620,(repeat_exact *)local_688);
            if ((tuple<toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                 )local_688._16_8_ != (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
              (*(*(_func_int ***)local_688._16_8_)[1])();
            }
            local_688._16_8_ =
                 (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                  )0x0;
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(auStack_718 + 8));
            sequence::scan((region *)local_688,&local_6a8,loc);
            if ((_func_int **)local_688._0_8_ == (_func_int **)0x0) {
              region::region((region *)local_620,loc);
              source_location::source_location((source_location *)local_720,(region *)local_620);
              region::~region((region *)local_620);
              local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4f8,
                         "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\uhhhh"
                         ,"");
              local_398.file_name_._M_dataplus._M_p = (pointer)&local_398.file_name_.field_2;
              local_398.last_offset_._0_4_ = auStack_718._40_4_;
              local_398.last_offset_._4_4_ = auStack_718._44_4_;
              local_398.length_._0_4_ = auStack_718._48_4_;
              local_398.length_._4_4_ = auStack_718._52_4_;
              local_398.last_line_._0_4_ = auStack_718._24_4_;
              local_398.last_line_._4_4_ = auStack_718._28_4_;
              local_398.last_column_._0_4_ = auStack_718._32_4_;
              local_398.last_column_._4_4_ = auStack_718._36_4_;
              local_398.first_column_._0_4_ = auStack_718._8_4_;
              local_398.first_column_._4_4_ = auStack_718._12_4_;
              local_398.first_offset_._0_4_ = auStack_718._16_4_;
              local_398.first_offset_._4_4_ = auStack_718._20_4_;
              local_398.first_line_ = auStack_718._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auStack_718._56_8_ == &local_6d0) {
                local_398.file_name_.field_2._8_8_ = local_6d0._8_8_;
              }
              else {
                local_398.file_name_._M_dataplus._M_p = (pointer)auStack_718._56_8_;
              }
              local_398.file_name_._M_string_length = auStack_718._64_8_;
              auStack_718._64_8_ = 0;
              local_6d0._M_local_buf[0] = '\0';
              local_398.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = local_6c0;
              local_398.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbStack_6b8;
              local_398.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6b0;
              local_6c0 = (pointer)0x0;
              pbStack_6b8 = (pointer)0x0;
              local_6b0 = (pointer)0x0;
              auStack_718._56_8_ = &local_6d0;
              local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"here","");
              make_error_info<>((error_info *)local_620,&local_4f8,&local_398,&local_518);
              err<toml::error_info>(&local_e0,(error_info *)local_620);
              __return_storage_ptr__->is_ok_ = false;
              failure<toml::error_info>::failure
                        ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                         &local_e0);
              failure<toml::error_info>::~failure(&local_e0);
              error_info::~error_info((error_info *)local_620);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_518._M_dataplus._M_p != &local_518.field_2) {
                operator_delete(local_518._M_dataplus._M_p,
                                local_518.field_2._M_allocated_capacity + 1);
              }
              source_location::~source_location(&local_398);
              local_538.field_2._M_allocated_capacity = local_4f8.field_2._M_allocated_capacity;
              _Var12._M_p = local_4f8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
LAB_003d3685:
                operator_delete(_Var12._M_p,local_538.field_2._M_allocated_capacity + 1);
              }
LAB_003d368d:
              source_location::~source_location((source_location *)local_720);
              region::~region((region *)local_688);
              std::
              vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              ::~vector(&local_6a8.others_);
              goto LAB_003d3538;
            }
            parse_utf8_codepoint<toml::type_config>
                      ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        *)local_720,(region *)local_688);
            if ((bool)local_720[0] == false) {
              err<toml::error_info_const&>(&local_240,(toml *)auStack_718,v_01);
              __return_storage_ptr__->is_ok_ = false;
              this = (EVP_PKEY_CTX *)&local_240;
LAB_003d3491:
              ctx_00 = this;
              failure<toml::error_info>::failure
                        ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                         (failure<toml::error_info> *)this);
              failure<toml::error_info>::~failure((failure<toml::error_info> *)this);
              cVar10 = local_720[0];
            }
            else {
              pvVar6 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                       ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                                 *)local_720,(source_location)0x568f28);
              ctx_00 = (EVP_PKEY_CTX *)(pvVar6->_M_dataplus)._M_p;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_740,(char *)ctx_00,pvVar6->_M_string_length);
              cVar10 = local_720[0];
            }
          }
          else {
            if ((uVar9 <= uVar11) || (*(char *)(lVar4 + uVar11) != 'U')) goto LAB_003d2d50;
            local_620._0_8_ = &PTR__scanner_base_005687c8;
            local_620[8] = 'U';
            syntax::hexdig::hexdig((hexdig *)local_720,&ctx->toml_spec_);
            local_688._0_8_ = &PTR__repeat_exact_005689e8;
            local_688._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
            scanner_storage::scanner_storage<toml::detail::syntax::hexdig,_nullptr>
                      ((scanner_storage *)(local_688 + 0x10),(hexdig *)local_720);
            sequence::sequence<toml::detail::character,toml::detail::repeat_exact>
                      (&local_6a8,(character *)local_620,(repeat_exact *)local_688);
            if ((tuple<toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                 )local_688._16_8_ != (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
              (*(*(_func_int ***)local_688._16_8_)[1])();
            }
            local_688._16_8_ =
                 (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                  )0x0;
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)(auStack_718 + 8));
            sequence::scan((region *)local_688,&local_6a8,loc);
            if ((_func_int **)local_688._0_8_ == (_func_int **)0x0) {
              region::region((region *)local_620,loc);
              source_location::source_location((source_location *)local_720,(region *)local_620);
              region::~region((region *)local_620);
              local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_538,
                         "toml::parse_escape_sequence: invalid token found in UTF-8 codepoint \\Uhhhhhhhh"
                         ,"");
              local_418.file_name_._M_dataplus._M_p = (pointer)&local_418.file_name_.field_2;
              local_418.last_offset_._0_4_ = auStack_718._40_4_;
              local_418.last_offset_._4_4_ = auStack_718._44_4_;
              local_418.length_._0_4_ = auStack_718._48_4_;
              local_418.length_._4_4_ = auStack_718._52_4_;
              local_418.last_line_._0_4_ = auStack_718._24_4_;
              local_418.last_line_._4_4_ = auStack_718._28_4_;
              local_418.last_column_._0_4_ = auStack_718._32_4_;
              local_418.last_column_._4_4_ = auStack_718._36_4_;
              local_418.first_column_._0_4_ = auStack_718._8_4_;
              local_418.first_column_._4_4_ = auStack_718._12_4_;
              local_418.first_offset_._0_4_ = auStack_718._16_4_;
              local_418.first_offset_._4_4_ = auStack_718._20_4_;
              local_418.first_line_ = auStack_718._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auStack_718._56_8_ == &local_6d0) {
                local_418.file_name_.field_2._8_8_ = local_6d0._8_8_;
              }
              else {
                local_418.file_name_._M_dataplus._M_p = (pointer)auStack_718._56_8_;
              }
              local_418.file_name_._M_string_length = auStack_718._64_8_;
              auStack_718._64_8_ = 0;
              local_6d0._M_local_buf[0] = '\0';
              local_418.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = local_6c0;
              local_418.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbStack_6b8;
              local_418.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6b0;
              local_6c0 = (pointer)0x0;
              pbStack_6b8 = (pointer)0x0;
              local_6b0 = (pointer)0x0;
              auStack_718._56_8_ = &local_6d0;
              local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"here","");
              make_error_info<>((error_info *)local_620,&local_538,&local_418,&local_558);
              err<toml::error_info>(&local_138,(error_info *)local_620);
              __return_storage_ptr__->is_ok_ = false;
              failure<toml::error_info>::failure
                        ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                         &local_138);
              failure<toml::error_info>::~failure(&local_138);
              error_info::~error_info((error_info *)local_620);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_558._M_dataplus._M_p != &local_558.field_2) {
                operator_delete(local_558._M_dataplus._M_p,
                                local_558.field_2._M_allocated_capacity + 1);
              }
              source_location::~source_location(&local_418);
              _Var12._M_p = local_538._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._M_dataplus._M_p != &local_538.field_2) goto LAB_003d3685;
              goto LAB_003d368d;
            }
            parse_utf8_codepoint<toml::type_config>
                      ((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                        *)local_720,(region *)local_688);
            if ((bool)local_720[0] == false) {
              err<toml::error_info_const&>(&local_298,(toml *)auStack_718,v_02);
              __return_storage_ptr__->is_ok_ = false;
              this = (EVP_PKEY_CTX *)&local_298;
              goto LAB_003d3491;
            }
            pvVar6 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                     ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                               *)local_720,(source_location)0x568f40);
            ctx_00 = (EVP_PKEY_CTX *)(pvVar6->_M_dataplus)._M_p;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_740,(char *)ctx_00,pvVar6->_M_string_length);
            cVar10 = local_720[0];
          }
LAB_003d34a1:
          result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
          ::cleanup((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                     *)local_720,ctx_00);
          region::~region((region *)local_688);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_6a8.others_);
          v = extraout_RDX_00;
          if (cVar10 == '\0') goto LAB_003d3538;
          goto LAB_003d34ca;
        }
      }
LAB_003d2d50:
      region::region((region *)local_688,loc);
      source_location::source_location((source_location *)local_720,(region *)local_688);
      region::~region((region *)local_688);
      local_620._0_8_ = local_620 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_620,"allowed escape seqs: \\\\, \\\", \\b, \\f, \\n, \\r, \\t","");
      if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_e == true) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                   ", \\e");
      }
      if ((ctx->toml_spec_).v1_1_0_add_escape_sequence_x == true) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                   ", \\xhh");
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                 ", \\uhhhh, or \\Uhhhhhhhh");
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_578,"toml::parse_escape_sequence: unknown escape sequence.","");
      local_498.file_name_._M_dataplus._M_p = (pointer)&local_498.file_name_.field_2;
      local_498.last_offset_._0_4_ = auStack_718._40_4_;
      local_498.last_offset_._4_4_ = auStack_718._44_4_;
      local_498.length_._0_4_ = auStack_718._48_4_;
      local_498.length_._4_4_ = auStack_718._52_4_;
      local_498.last_line_._0_4_ = auStack_718._24_4_;
      local_498.last_line_._4_4_ = auStack_718._28_4_;
      local_498.last_column_._0_4_ = auStack_718._32_4_;
      local_498.last_column_._4_4_ = auStack_718._36_4_;
      local_498.first_column_._0_4_ = auStack_718._8_4_;
      local_498.first_column_._4_4_ = auStack_718._12_4_;
      local_498.first_offset_._0_4_ = auStack_718._16_4_;
      local_498.first_offset_._4_4_ = auStack_718._20_4_;
      local_498.first_line_ = auStack_718._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_718._56_8_ == &local_6d0) {
        local_498.file_name_.field_2._8_8_ = local_6d0._8_8_;
      }
      else {
        local_498.file_name_._M_dataplus._M_p = (pointer)auStack_718._56_8_;
      }
      local_498.file_name_._M_string_length = auStack_718._64_8_;
      auStack_718._64_8_ = 0;
      local_6d0._M_local_buf[0] = '\0';
      local_498.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_6c0;
      local_498.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbStack_6b8;
      local_498.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_6b0;
      local_6c0 = (pointer)0x0;
      pbStack_6b8 = (pointer)0x0;
      local_6b0 = (pointer)0x0;
      auStack_718._56_8_ = &local_6d0;
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,local_620._0_8_,
                 (pointer)(local_620._0_8_ + CONCAT71(local_620._9_7_,local_620[8])));
      make_error_info<>((error_info *)local_688,&local_578,&local_498,&local_598);
      err<toml::error_info>(&local_190,(error_info *)local_688);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_190);
      failure<toml::error_info>::~failure(&local_190);
      error_info::~error_info((error_info *)local_688);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location(&local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_620._0_8_ != local_620 + 0x10) {
        operator_delete((void *)local_620._0_8_,local_620._16_8_ + 1);
      }
      source_location::~source_location((source_location *)local_720);
      goto LAB_003d3538;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_740,'\x1b');
LAB_003d29eb:
    location::advance(loc,1);
    v = extraout_RDX;
  }
LAB_003d34ca:
  ok<std::__cxx11::string&>(&local_5b8,(toml *)&local_740,v);
  __return_storage_ptr__->is_ok_ = true;
  paVar1 = &(__return_storage_ptr__->field_1).succ_.value.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&__return_storage_ptr__->field_1 = paVar1;
  paVar2 = &local_5b8.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.value._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_5b8.value.field_2._M_allocated_capacity._1_7_,
                  local_5b8.value.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ_.value.field_2 + 8) =
         local_5b8.value.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->field_1).succ_.value._M_dataplus._M_p =
         local_5b8.value._M_dataplus._M_p;
    (__return_storage_ptr__->field_1).succ_.value.field_2._M_allocated_capacity =
         CONCAT71(local_5b8.value.field_2._M_allocated_capacity._1_7_,
                  local_5b8.value.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->field_1).succ_.value._M_string_length = local_5b8.value._M_string_length;
  local_5b8.value._M_string_length = 0;
  local_5b8.value.field_2._M_local_buf[0] = '\0';
  local_5b8.value._M_dataplus._M_p = (pointer)paVar2;
LAB_003d3538:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,
                    CONCAT71(local_740.field_2._M_allocated_capacity._1_7_,
                             local_740.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result<typename basic_value<TC>::string_type, error_info>
parse_escape_sequence(location& loc, const context<TC>& ctx)
{
    using string_type = typename basic_value<TC>::string_type;
    using char_type = typename string_type::value_type;

    const auto& spec = ctx.toml_spec();

    assert( ! loc.eof());
    assert(loc.current() == '\\');
    loc.advance(); // consume the first backslash

    string_type retval;

    if     (loc.current() == '\\') { retval += char_type('\\'); loc.advance(); }
    else if(loc.current() == '"')  { retval += char_type('\"'); loc.advance(); }
    else if(loc.current() == 'b')  { retval += char_type('\b'); loc.advance(); }
    else if(loc.current() == 'f')  { retval += char_type('\f'); loc.advance(); }
    else if(loc.current() == 'n')  { retval += char_type('\n'); loc.advance(); }
    else if(loc.current() == 'r')  { retval += char_type('\r'); loc.advance(); }
    else if(loc.current() == 't')  { retval += char_type('\t'); loc.advance(); }
    else if(spec.v1_1_0_add_escape_sequence_e && loc.current() == 'e')
    {
        retval += char_type('\x1b');
        loc.advance();
    }
    else if(spec.v1_1_0_add_escape_sequence_x && loc.current() == 'x')
    {
        auto scanner = sequence(character('x'), repeat_exact(2, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\xhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'u')
    {
        auto scanner = sequence(character('u'), repeat_exact(4, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\uhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else if(loc.current() == 'U')
    {
        auto scanner = sequence(character('U'), repeat_exact(8, syntax::hexdig(spec)));
        const auto reg = scanner.scan(loc);
        if( ! reg.is_ok())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_escape_sequence: "
                   "invalid token found in UTF-8 codepoint \\Uhhhhhhhh",
                   std::move(src), "here"));
        }
        const auto utf8 = parse_utf8_codepoint<TC>(reg);
        if(utf8.is_err())
        {
            return err(utf8.as_err());
        }
        retval += utf8.unwrap();
    }
    else
    {
        auto src = source_location(region(loc));
        std::string escape_seqs = "allowed escape seqs: \\\\, \\\", \\b, \\f, \\n, \\r, \\t";
        if(spec.v1_1_0_add_escape_sequence_e)
        {
            escape_seqs += ", \\e";
        }
        if(spec.v1_1_0_add_escape_sequence_x)
        {
            escape_seqs += ", \\xhh";
        }
        escape_seqs += ", \\uhhhh, or \\Uhhhhhhhh";

        return err(make_error_info("toml::parse_escape_sequence: "
               "unknown escape sequence.", std::move(src), escape_seqs));
    }
    return ok(retval);
}